

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O2

int __thiscall
cplus::socket::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  ServerException *this_00;
  int *__optval;
  sockaddr *__addr_00;
  int __fd_00;
  int opt;
  
  (this->server_addr).sin_zero[0] = '\0';
  (this->server_addr).sin_zero[1] = '\0';
  (this->server_addr).sin_zero[2] = '\0';
  (this->server_addr).sin_zero[3] = '\0';
  (this->server_addr).sin_zero[4] = '\0';
  (this->server_addr).sin_zero[5] = '\0';
  (this->server_addr).sin_zero[6] = '\0';
  (this->server_addr).sin_zero[7] = '\0';
  (this->server_addr).sin_family = 2;
  (this->server_addr).sin_addr.s_addr = 0;
  (this->server_addr).sin_port = (ushort)__fd << 8 | (ushort)__fd >> 8;
  iVar1 = ::socket(2,1,0);
  this->server_socket = iVar1;
  if (-1 < iVar1) {
    __optval = &opt;
    __fd_00 = 1;
    setsockopt(iVar1,1,2,__optval,4);
    iVar1 = bind(this,__fd_00,__addr_00,(socklen_t)__optval);
    return iVar1;
  }
  this_00 = (ServerException *)__cxa_allocate_exception(0x838);
  ServerException::ServerException(this_00,"Create Socket Failed!");
  __cxa_throw(this_00,&ServerException::typeinfo,system::Exception::~Exception);
}

Assistant:

int SocketServer::bind(uint16_t port) {
			bzero(&server_addr, sizeof(server_addr)); //把一段内存区的内容全部设置为0
			server_addr.sin_family = AF_INET;
			server_addr.sin_addr.s_addr = htons(INADDR_ANY);
			server_addr.sin_port = htons(port);
			//创建用于internet的流协议(TCP)socket,用server_socket代表服务器socket
			server_socket = ::socket(PF_INET, SOCK_STREAM, 0);
			if (server_socket < 0) {
				throw ServerException("Create Socket Failed!");
			}
			int opt = 1;
			setsockopt(server_socket, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));
			//把socket和socket地址结构联系起来
			return bind();
		}